

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall Commands::MatchFailure::emit(MatchFailure *this,ProgramContext *program)

{
  SyntaxTree *context;
  string message;
  string local_38;
  
  to_string_abi_cxx11_(&local_38,this);
  context = (this->context).super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (context == (SyntaxTree *)0x0) {
    ProgramContext::error<tag_nocontext_t>
              (program,(tag_nocontext_t *)&nocontext,local_38._M_dataplus._M_p);
  }
  else {
    ProgramContext::error<SyntaxTree>(program,context,local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Commands::MatchFailure::emit(ProgramContext& program)
{
    auto message = this->to_string();
    if(this->context)
        program.error(*this->context, message.c_str());
    else
        program.error(nocontext, message.c_str());
}